

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage2RunnerNonRecursive.hpp
# Opt level: O0

void Centaurus::NonRecursiveReductionRunner::push_start_marker
               (CSTMarker *marker,
               vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_> *starts,
               vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
               *tags)

{
  StackEntryTag local_24;
  vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
  *local_20;
  vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
  *tags_local;
  vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_> *starts_local;
  CSTMarker *marker_local;
  
  local_24 = START_MARKER;
  local_20 = tags;
  tags_local = (vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
                *)starts;
  starts_local = (vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_> *)marker;
  std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>::
  emplace_back<Centaurus::detail::StackEntryTag>(tags,&local_24);
  std::vector<Centaurus::CSTMarker,std::allocator<Centaurus::CSTMarker>>::
  emplace_back<Centaurus::CSTMarker_const&>
            ((vector<Centaurus::CSTMarker,std::allocator<Centaurus::CSTMarker>> *)tags_local,
             (CSTMarker *)starts_local);
  return;
}

Assistant:

static void push_start_marker(const CSTMarker& marker, std::vector<CSTMarker>& starts, std::vector<detail::StackEntryTag>& tags)
  {
    tags.emplace_back(detail::StackEntryTag::START_MARKER);
    starts.emplace_back(marker);
  }